

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall xmrig::Network::setJob(Network *this,IClient *client,Job *job)

{
  uint64_t uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Miner *this_00;
  char *fmt;
  
  uVar1 = job->m_height;
  iVar3 = (*client->_vptr_IClient[10])(client);
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var,iVar3) + 0x90);
  iVar3 = (*client->_vptr_IClient[10])(client);
  if (uVar1 == 0) {
    fmt = "%s \x1b[1;35mnew job\x1b[0m from \x1b[1;37m%s:%d\x1b[0m diff \x1b[1;37m%lu\x1b[0m";
  }
  else {
    fmt = 
    "%s \x1b[1;35mnew job\x1b[0m from \x1b[1;37m%s:%d\x1b[0m diff \x1b[1;37m%lu\x1b[0m height \x1b[1;37m%lu\x1b[0m"
    ;
  }
  Log::print(INFO,fmt,"\x1b[44;1m\x1b[1;37m net \x1b[0m",uVar2,
             (ulong)*(ushort *)(CONCAT44(extraout_var_00,iVar3) + 0xb0),job->m_diff);
  (this->m_state).diff = job->m_diff;
  this_00 = Controller::miner(this->m_controller);
  Miner::setJob(this_00,job);
  return;
}

Assistant:

void xmrig::Network::setJob(IClient *client, const Job &job)
{
    if (job.height()) {
        LOG_INFO("%s " MAGENTA_BOLD("new job") " from " WHITE_BOLD("%s:%d") " diff " WHITE_BOLD("%" PRIu64) " height " WHITE_BOLD("%" PRIu64),
                 tag, client->pool().host().data(), client->pool().port(), job.diff(), job.height());
    }
    else {
        LOG_INFO("%s " MAGENTA_BOLD("new job") " from " WHITE_BOLD("%s:%d") " diff " WHITE_BOLD("%" PRIu64),
                 tag, client->pool().host().data(), client->pool().port(), job.diff());
    }

    m_state.diff = job.diff();
    m_controller->miner()->setJob(job);
}